

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

char * GetID(char **p)

{
  bool bVar1;
  int iVar2;
  char *p_00;
  char *pcVar3;
  
  iVar2 = SkipBlanks(p);
  if (iVar2 == 0) {
    p_00 = *p;
    bVar1 = isLabelStart(p_00,false);
    if ((bVar1) || (*p_00 == '.')) {
      pcVar3 = nidtemp;
      while (iVar2 = islabchar(*p_00), iVar2 != 0) {
        *p = p_00 + 1;
        *pcVar3 = *p_00;
        pcVar3 = pcVar3 + 1;
        p_00 = *p;
      }
      *pcVar3 = '\0';
      return nidtemp;
    }
  }
  return (char *)0x0;
}

Assistant:

char* GetID(char*& p) {
	char* np = nidtemp;
	if (SkipBlanks(p) || (!isLabelStart(p, false) && *p != '.')) return nullptr;
	while (islabchar((byte)*p)) *np++ = *p++;
	*np = 0;
	return nidtemp;
}